

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

errr finish_parse_world(parser *p)

{
  level *plVar1;
  char *pcVar2;
  level *plVar3;
  int iVar4;
  level **pplVar5;
  
  pplVar5 = &world;
  do {
    plVar1 = *pplVar5;
    if (plVar1 == (level *)0x0) {
      parser_destroy(p);
      return 0;
    }
    pcVar2 = plVar1->up;
    if (pcVar2 != (char *)0x0) {
      pplVar5 = &world;
      do {
        plVar3 = *pplVar5;
        if (plVar3 == (level *)0x0) {
          quit_fmt("Invalid level reference %s",pcVar2);
          break;
        }
        iVar4 = strcmp(pcVar2,plVar3->name);
        pplVar5 = &plVar3->next;
      } while (iVar4 != 0);
    }
    pcVar2 = plVar1->down;
    if (pcVar2 != (char *)0x0) {
      pplVar5 = &world;
      do {
        plVar3 = *pplVar5;
        if (plVar3 == (level *)0x0) {
          quit_fmt("Invalid level reference %s",pcVar2);
          break;
        }
        iVar4 = strcmp(pcVar2,plVar3->name);
        pplVar5 = &plVar3->next;
      } while (iVar4 != 0);
    }
    pplVar5 = &plVar1->next;
  } while( true );
}

Assistant:

static errr finish_parse_world(struct parser *p) {
	struct level *level_check;

	/* Check that all levels referred to exist */
	for (level_check = world; level_check; level_check = level_check->next) {
		struct level *level_find = world;

		/* Check upwards */
		if (level_check->up) {
			while (level_find && !streq(level_check->up, level_find->name)) {
				level_find = level_find->next;
			}
			if (!level_find) {
				quit_fmt("Invalid level reference %s", level_check->up);
			}
		}

		/* Check downwards */
		level_find = world;
		if (level_check->down) {
			while (level_find && !streq(level_check->down, level_find->name)) {
				level_find = level_find->next;
			}
			if (!level_find) {
				quit_fmt("Invalid level reference %s", level_check->down);
			}
		}
	}

	parser_destroy(p);
	return 0;
}